

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

void findgotos(LexState *ls,Labeldesc *lb)

{
  Dyndata *pDVar1;
  int g;
  
  pDVar1 = ls->dyd;
  g = ls->fs->bl->firstgoto;
  do {
    while( true ) {
      if ((pDVar1->gt).n <= g) {
        return;
      }
      if ((pDVar1->gt).arr[g].name != lb->name) break;
      closegoto(ls,g,lb);
    }
    g = g + 1;
  } while( true );
}

Assistant:

static void findgotos (LexState *ls, Labeldesc *lb) {
  Labellist *gl = &ls->dyd->gt;
  int i = ls->fs->bl->firstgoto;
  while (i < gl->n) {
    if (eqstr(gl->arr[i].name, lb->name))
      closegoto(ls, i, lb);
    else
      i++;
  }
}